

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O0

void __thiscall
upb_test::FuzzTest_RoundTripDescriptorRegression_Test::FuzzTest_RoundTripDescriptorRegression_Test
          (FuzzTest_RoundTripDescriptorRegression_Test *this)

{
  FuzzTest_RoundTripDescriptorRegression_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__FuzzTest_RoundTripDescriptorRegression_Test_00a153c0;
  return;
}

Assistant:

TEST(FuzzTest, RoundTripDescriptorRegression) {
  RoundTripDescriptor(ParseTextProtoOrDie(R"pb(file {
                                                 name: ""
                                                 message_type {
                                                   name: "A"
                                                   field {
                                                     name: "B"
                                                     number: 1
                                                     type: TYPE_BYTES
                                                     default_value: "\007"
                                                   }
                                                 }
                                               })pb"));
}